

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

void do_error(dmr_C *C,position pos,char *fmt,__va_list_tag *args)

{
  __va_list_tag *args_local;
  char *fmt_local;
  dmr_C *C_local;
  position pos_local;
  
  C->die_if_error = 1;
  C->show_info = 1;
  C->has_error = C->has_error | 1;
  C->max_warnings = 0;
  args_local = (__va_list_tag *)fmt;
  if (100 < C->errors) {
    C->show_info = 0;
    if (C->once != 0) {
      return;
    }
    args_local = (__va_list_tag *)anon_var_dwarf_1647d;
    C->once = 1;
  }
  do_warn(C,"error: ",pos,(char *)args_local,args);
  C->errors = C->errors + 1;
  return;
}

Assistant:

static void do_error(struct dmr_C *C, struct position pos, const char *fmt,
		     va_list args)
{
	C->die_if_error = 1;
	C->show_info = 1;
	/* Shut up warnings after an error */
	C->has_error |= ERROR_CURR_PHASE;
	C->max_warnings = 0;
	if (C->errors > 100) {
		C->show_info = 0;
		if (C->once)
			return;
		fmt = "too many errors";
		C->once = 1;
	}

	do_warn(C, "error: ", pos, fmt, args);
	C->errors++;
}